

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O2

void __thiscall InlineTable_MustBeOneLine3_Test::TestBody(InlineTable_MustBeOneLine3_Test *this)

{
  AssertHelper aAStack_1d8 [2];
  AssertionResult gtest_ar;
  events_aggregator_t handler;
  istringstream input;
  
  std::__cxx11::string::string
            ((string *)&handler,"key = {\"key\" =123\n,\tkey=345 , 123 = \t\'value\' } ",
             (allocator *)&gtest_ar);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&handler,_S_in);
  std::__cxx11::string::~string((string *)&handler);
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)&input,&handler);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_1d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/inline_table.cpp"
             ,0xc4,"Failed");
  testing::internal::AssertHelper::operator=(aAStack_1d8,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(aAStack_1d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&handler.events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  return;
}

Assistant:

TEST(InlineTable, MustBeOneLine3) {
    std::istringstream input("key = {\"key\" =123\n,\tkey=345 , 123 = \t'value' } ");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(17, e.offset());
    }
}